

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O3

bool __thiscall crnlib::mipmapped_texture::has_alpha(mipmapped_texture *this)

{
  pixel_format pVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->m_faces).m_size == 0) {
    return false;
  }
  pVar1 = this->m_format;
  if ((int)pVar1 < 0x41315844) {
    if ((int)pVar1 < 0x33545844) {
      if (pVar1 == PIXEL_FMT_DXT5A) {
        return true;
      }
      if (pVar1 == PIXEL_FMT_DXT1) {
        if ((*((this->m_faces).m_p)->m_p)->m_pDXTImage != (dxt_image *)0x0) {
          lVar3 = 0;
          uVar4 = 0;
          do {
            bVar2 = dxt_image::has_alpha
                              (*(dxt_image **)
                                (**(long **)((long)&((this->m_faces).m_p)->m_p + lVar3) + 0x18));
            if (bVar2) {
              return bVar2;
            }
            uVar4 = uVar4 + 1;
            lVar3 = lVar3 + 0x10;
          } while (uVar4 < (this->m_faces).m_size);
          return bVar2;
        }
      }
      else if (pVar1 == PIXEL_FMT_DXT2) {
        return true;
      }
    }
    else {
      if (pVar1 == PIXEL_FMT_DXT3) {
        return true;
      }
      if (pVar1 == PIXEL_FMT_DXT4) {
        return true;
      }
      if (pVar1 == PIXEL_FMT_DXT5) {
        return true;
      }
    }
  }
  else if ((int)pVar1 < 0x4178784c) {
    if (pVar1 == PIXEL_FMT_DXT1A) {
      return true;
    }
    if (pVar1 == PIXEL_FMT_ETC2A) {
      return true;
    }
    if (pVar1 == PIXEL_FMT_A8R8G8B8) {
      return true;
    }
  }
  else if ((int)pVar1 < 0x52424741) {
    if (pVar1 == PIXEL_FMT_A8L8) {
      return true;
    }
    if (pVar1 == PIXEL_FMT_A8) {
      return true;
    }
  }
  else {
    if (pVar1 == PIXEL_FMT_DXT5_AGBR) {
      return true;
    }
    if (pVar1 == PIXEL_FMT_ETC2AS) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool is_valid() const { return m_faces.size() > 0; }